

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelpers.cpp
# Opt level: O2

int StringHelpers::stringToNumber(string *s)

{
  long *plVar1;
  int iVar2;
  int result;
  istringstream convert;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&convert,(string *)s,_S_in);
  plVar1 = (long *)std::istream::operator>>((istream *)&convert,&result);
  iVar2 = 0;
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    iVar2 = result;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&convert);
  return iVar2;
}

Assistant:

int StringHelpers::stringToNumber(string s)
{
	istringstream convert(s);
	int result;
	if (!(convert >> result))
	{
		result = 0;
	}
	return result;
}